

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationBasicSemaphoreTests.cpp
# Opt level: O0

TestStatus *
vkt::synchronization::anon_unknown_0::basicMultiQueueCase
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice pVVar1;
  VkDevice_s *pVVar2;
  RefData<vk::VkDevice_s_*> data;
  RefData<vk::Handle<(vk::HandleType)4>_> data_00;
  RefData<vk::Handle<(vk::HandleType)24>_> data_01;
  RefData<vk::Handle<(vk::HandleType)24>_> data_02;
  RefData<vk::VkCommandBuffer_s_*> data_03;
  RefData<vk::VkCommandBuffer_s_*> data_04;
  RefData<vk::Handle<(vk::HandleType)6>_> data_05;
  RefData<vk::Handle<(vk::HandleType)6>_> data_06;
  VkSemaphore *pVVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  VkSemaphore *pVVar9;
  VkPipelineStageFlags *pVVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  VkCommandBuffer *ppVVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  VkResult VVar16;
  int iVar17;
  DeviceInterface *vk_00;
  InstanceInterface *vk_01;
  VkPhysicalDevice physicalDevice_00;
  ulong uVar18;
  size_type sVar19;
  reference pvVar20;
  NotSupportedError *this;
  VkDevice_s **ppVVar21;
  Handle<(vk::HandleType)24> *pHVar22;
  VkCommandBuffer_s **ppVVar23;
  Handle<(vk::HandleType)6> *pHVar24;
  VkAllocationCallbacks **local_a00;
  VkCommandPool *local_9d0;
  VkAllocationCallbacks **local_9b8;
  Move<vk::Handle<(vk::HandleType)6>_> *local_798;
  Move<vk::VkCommandBuffer_s_*> *local_778;
  VkCommandPool *local_758;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  deUint64 local_6c8;
  deUint64 local_6c0;
  VkSemaphore *pVStack_6b8;
  VkSubmitInfo swapInfo;
  allocator<char> local_661;
  string local_660;
  undefined4 local_640;
  allocator<char> local_639;
  string local_638;
  deUint64 local_618;
  deUint64 local_610;
  Move<vk::Handle<(vk::HandleType)6>_> local_608;
  RefData<vk::Handle<(vk::HandleType)6>_> local_5e8;
  Move<vk::Handle<(vk::HandleType)6>_> local_5c8;
  RefData<vk::Handle<(vk::HandleType)6>_> local_5a8;
  deUint64 local_588;
  Move<vk::VkCommandBuffer_s_*> local_580;
  RefData<vk::VkCommandBuffer_s_*> local_560;
  deUint64 local_540;
  Move<vk::VkCommandBuffer_s_*> local_538;
  RefData<vk::VkCommandBuffer_s_*> local_518;
  Move<vk::Handle<(vk::HandleType)24>_> local_4f8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_4d8;
  Move<vk::Handle<(vk::HandleType)24>_> local_4b8;
  RefData<vk::Handle<(vk::HandleType)24>_> local_498;
  Move<vk::Handle<(vk::HandleType)4>_> local_478;
  RefData<vk::Handle<(vk::HandleType)4>_> local_458;
  uint local_434;
  undefined1 local_430 [4];
  deUint32 queueReqNdx;
  RefData<vk::VkDevice_s_*> local_418;
  undefined4 local_400 [2];
  VkDeviceQueueCreateInfo queueInfo;
  int queueNdx_1;
  deUint32 queueNdx;
  undefined1 local_3b8 [8];
  Move<vk::Handle<(vk::HandleType)6>_> fence [2];
  VkSubmitInfo submitInfo [2];
  undefined1 local_2dc [8];
  VkPipelineStageFlags stageBits [1];
  Move<vk::VkCommandBuffer_s_*> cmdBuffer [2];
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool [2];
  undefined1 local_248 [8];
  Move<vk::Handle<(vk::HandleType)4>_> semaphore;
  VkCommandBufferBeginInfo info;
  Queues queues [2];
  VkDeviceQueueCreateInfo queueInfos [2];
  undefined8 local_190;
  float queuePriorities [2];
  VkPhysicalDeviceFeatures deviceFeatures;
  VkDeviceCreateInfo deviceInfo;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  Move<vk::VkDevice_s_*> logicalDevice;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instance;
  DeviceInterface *vk;
  Context *context_local;
  
  vk_00 = Context::getDeviceInterface(context);
  vk_01 = Context::getInstanceInterface(context);
  physicalDevice_00 = Context::getPhysicalDevice(context);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::Move
            ((Move<vk::VkDevice_s_*> *)
             &queueFamilyProperties.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &deviceInfo.pEnabledFeatures);
  local_190 = 0x3f8000003f800000;
  queues[0].queueFamilyIndex = 0;
  queues[0]._12_4_ = 0;
  queues[1].queue = (VkQueue)0xffffffff;
  queues[0].queue = (VkQueue)0xffffffff;
  semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x2a;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::Move
            ((Move<vk::Handle<(vk::HandleType)4>_> *)local_248);
  local_758 = &cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_758);
    local_758 = local_758 + 4;
  } while (local_758 !=
           (VkCommandPool *)
           &cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  local_778 = (Move<vk::VkCommandBuffer_s_*> *)(local_2dc + 4);
  do {
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::Move(local_778);
    local_778 = local_778 + 1;
  } while (local_778 !=
           (Move<vk::VkCommandBuffer_s_*> *)
           &cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  local_2dc._0_4_ = 1;
  local_798 = (Move<vk::Handle<(vk::HandleType)6>_> *)local_3b8;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::Move(local_798);
    local_798 = local_798 + 1;
  } while (local_798 !=
           (Move<vk::Handle<(vk::HandleType)6>_> *)
           &fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &queueNdx_1,vk_01,physicalDevice_00);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::operator=
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &deviceInfo.pEnabledFeatures,
             (vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &queueNdx_1);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::~vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &queueNdx_1);
  for (queueInfo.pQueuePriorities._4_4_ = 0; uVar18 = (ulong)queueInfo.pQueuePriorities._4_4_,
      sVar19 = std::
               vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
               size((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                     *)&deviceInfo.pEnabledFeatures), uVar18 < sVar19;
      queueInfo.pQueuePriorities._4_4_ = queueInfo.pQueuePriorities._4_4_ + 1) {
    if ((uint)queues[0].queue == -1) {
      queues[0].queue = (VkQueue)CONCAT44(queues[0].queue._4_4_,queueInfo.pQueuePriorities._4_4_);
    }
    if (((uint)queues[0].queue != queueInfo.pQueuePriorities._4_4_) ||
       (pvVar20 = std::
                  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                  ::operator[]((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                *)&deviceInfo.pEnabledFeatures,
                               (ulong)queueInfo.pQueuePriorities._4_4_), 1 < pvVar20->queueCount)) {
      queues[1].queue = (VkQueue)CONCAT44(queues[1].queue._4_4_,queueInfo.pQueuePriorities._4_4_);
      break;
    }
  }
  if (((uint)queues[0].queue == -1) || ((deUint32)queues[1].queue == -1)) {
    this = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this,"Queues couldn\'t be created",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
               ,0x9b);
    __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
  }
  for (queueInfo.pQueuePriorities._0_4_ = 0; (int)queueInfo.pQueuePriorities < 2;
      queueInfo.pQueuePriorities._0_4_ = (int)queueInfo.pQueuePriorities + 1) {
    ::deMemset(local_400,0,0x28);
    local_400[0] = 2;
    queueInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    queueInfo._4_4_ = 0;
    queueInfo.pNext._0_4_ = 0;
    queueInfo.pNext._4_4_ = *(undefined4 *)&queues[(int)queueInfo.pQueuePriorities].queue;
    queueInfo.flags = 1;
    if ((uint)queues[0].queue == (deUint32)queues[1].queue) {
      queueInfo.flags = 2;
    }
    queueInfo._24_8_ = &local_190;
    memcpy(&queueInfos[(long)(int)queueInfo.pQueuePriorities + -1].pQueuePriorities,local_400,0x28);
    if ((uint)queues[0].queue == (deUint32)queues[1].queue) break;
  }
  ::deMemset(&deviceFeatures.variableMultisampleRate,0,0x48);
  (*vk_01->_vptr_InstanceInterface[2])(vk_01,physicalDevice_00,queuePriorities + 1);
  deviceFeatures.variableMultisampleRate = 3;
  deviceInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceInfo._4_4_ = 0;
  deviceInfo.ppEnabledLayerNames._0_4_ = 0;
  deviceInfo.enabledExtensionCount = 0;
  deviceInfo._52_4_ = 0;
  deviceInfo.pQueueCreateInfos._0_4_ = 0;
  deviceInfo.enabledLayerCount = 0;
  deviceInfo._36_4_ = 0;
  deviceInfo.ppEnabledExtensionNames = (char **)(queuePriorities + 1);
  deviceInfo.pNext._4_4_ = ((uint)queues[0].queue != (deUint32)queues[1].queue) + 1;
  deviceInfo._16_8_ = &queues[1].queueFamilyIndex;
  ::vk::createDevice((Move<vk::VkDevice_s_*> *)local_430,vk_01,physicalDevice_00,
                     (VkDeviceCreateInfo *)&deviceFeatures.variableMultisampleRate,
                     (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_418,(Move *)local_430);
  data.deleter.m_destroyDevice = local_418.deleter.m_destroyDevice;
  data.object = local_418.object;
  data.deleter.m_allocator = local_418.deleter.m_allocator;
  ::vk::refdetails::Move<vk::VkDevice_s_*>::operator=
            ((Move<vk::VkDevice_s_*> *)
             &queueFamilyProperties.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,data);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move((Move<vk::VkDevice_s_*> *)local_430);
  local_434 = 0;
  while( true ) {
    if (1 < local_434) break;
    if ((uint)queues[0].queue == (deUint32)queues[1].queue) {
      ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                           ((RefBase<vk::VkDevice_s_*> *)
                            &queueFamilyProperties.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*vk_00->_vptr_DeviceInterface[1])
                (vk_00,*ppVVar21,(ulong)*(uint *)&queues[local_434].queue,(ulong)local_434,
                 &queues[(ulong)local_434 - 1].queueFamilyIndex);
    }
    else {
      ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                           ((RefBase<vk::VkDevice_s_*> *)
                            &queueFamilyProperties.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      (*vk_00->_vptr_DeviceInterface[1])
                (vk_00,*ppVVar21,(ulong)*(uint *)&queues[local_434].queue,0,
                 &queues[(ulong)local_434 - 1].queueFamilyIndex);
    }
    local_434 = local_434 + 1;
  }
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::createSemaphore(&local_478,vk_00,*ppVVar21,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_458,(Move *)&local_478);
  data_00.deleter.m_deviceIface = local_458.deleter.m_deviceIface;
  data_00.object.m_internal = local_458.object.m_internal;
  data_00.deleter.m_device = local_458.deleter.m_device;
  data_00.deleter.m_allocator = local_458.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)4>_> *)local_248,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move(&local_478);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::createCommandPool
            (&local_4b8,vk_00,*ppVVar21,2,(uint)queues[0].queue,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_498,(Move *)&local_4b8);
  data_01.deleter.m_deviceIface = local_498.deleter.m_deviceIface;
  data_01.object.m_internal = local_498.object.m_internal;
  data_01.deleter.m_device = local_498.deleter.m_device;
  data_01.deleter.m_allocator = local_498.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_4b8);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::createCommandPool
            (&local_4f8,vk_00,*ppVVar21,2,(deUint32)queues[1].queue,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4d8,(Move *)&local_4f8);
  data_02.deleter.m_deviceIface = local_4d8.deleter.m_deviceIface;
  data_02.object.m_internal = local_4d8.object.m_internal;
  data_02.deleter.m_device = local_4d8.deleter.m_device;
  data_02.deleter.m_allocator = local_4d8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move(&local_4f8);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar21;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                       &cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  local_540 = pHVar22->m_internal;
  makeCommandBuffer(&local_538,vk_00,pVVar1,(VkCommandPool)local_540);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_518,(Move *)&local_538);
  data_03.deleter.m_deviceIface = local_518.deleter.m_deviceIface;
  data_03.object = local_518.object;
  data_03.deleter.m_device = local_518.deleter.m_device;
  data_03.deleter.m_pool.m_internal = local_518.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=
            ((Move<vk::VkCommandBuffer_s_*> *)(local_2dc + 4),data_03);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_538);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar1 = *ppVVar21;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                       &cmdPool[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                        m_allocator);
  local_588 = pHVar22->m_internal;
  makeCommandBuffer(&local_580,vk_00,pVVar1,(VkCommandPool)local_588);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_560,(Move *)&local_580);
  data_04.deleter.m_deviceIface = local_560.deleter.m_deviceIface;
  data_04.object = local_560.object;
  data_04.deleter.m_device = local_560.deleter.m_device;
  data_04.deleter.m_pool.m_internal = local_560.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::operator=
            ((Move<vk::VkCommandBuffer_s_*> *)
             &cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,data_04);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_580);
  fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       CONCAT44(fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator.
                _4_4_,4);
  submitInfo[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo[0]._4_4_ = 0;
  submitInfo[0].pNext = (void *)((ulong)submitInfo[0].pNext._4_4_ << 0x20);
  submitInfo[0].waitSemaphoreCount = 0;
  submitInfo[0]._20_4_ = 0;
  submitInfo[0].pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo[0].pWaitDstStageMask =
       (VkPipelineStageFlags *)CONCAT44(submitInfo[0].pWaitDstStageMask._4_4_,1);
  submitInfo[0]._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)(local_2dc + 4));
  submitInfo[0].pCommandBuffers = (VkCommandBuffer *)CONCAT44(submitInfo[0].pCommandBuffers._4_4_,1)
  ;
  submitInfo[0]._56_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_248);
  submitInfo[0].pSignalSemaphores = (VkSemaphore *)CONCAT44(submitInfo[0].pSignalSemaphores._4_4_,4)
  ;
  submitInfo[1].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo[1]._4_4_ = 0;
  submitInfo[1].pNext = (void *)CONCAT44(submitInfo[1].pNext._4_4_,1);
  submitInfo[1]._16_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_248);
  submitInfo[1].pWaitSemaphores = (VkSemaphore *)local_2dc;
  submitInfo[1].pWaitDstStageMask =
       (VkPipelineStageFlags *)CONCAT44(submitInfo[1].pWaitDstStageMask._4_4_,1);
  submitInfo[1]._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)
                  &cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  submitInfo[1].pCommandBuffers =
       (VkCommandBuffer *)((ulong)submitInfo[1].pCommandBuffers._4_4_ << 0x20);
  submitInfo[1].signalSemaphoreCount = 0;
  submitInfo[1]._60_4_ = 0;
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)(local_2dc + 4));
  VVar16 = (*vk_00->_vptr_DeviceInterface[0x49])
                     (vk_00,*ppVVar23,
                      &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                       m_allocator);
  ::vk::checkResult(VVar16,"vk.beginCommandBuffer(*cmdBuffer[FIRST], &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe0);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)(local_2dc + 4));
  endCommandBuffer(vk_00,*ppVVar23);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  VVar16 = (*vk_00->_vptr_DeviceInterface[0x49])
                     (vk_00,*ppVVar23,
                      &semaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
                       m_allocator);
  ::vk::checkResult(VVar16,"vk.beginCommandBuffer(*cmdBuffer[SECOND], &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe2);
  ppVVar23 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)
                        &cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  endCommandBuffer(vk_00,*ppVVar23);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::createFence(&local_5c8,vk_00,*ppVVar21,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5a8,(Move *)&local_5c8);
  data_05.deleter.m_deviceIface = local_5a8.deleter.m_deviceIface;
  data_05.object.m_internal = local_5a8.object.m_internal;
  data_05.deleter.m_device = local_5a8.deleter.m_device;
  data_05.deleter.m_allocator = local_5a8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)6>_> *)local_3b8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_5c8);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::createFence(&local_608,vk_00,*ppVVar21,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5e8,(Move *)&local_608);
  data_06.deleter.m_deviceIface = local_5e8.deleter.m_deviceIface;
  data_06.object.m_internal = local_5e8.object.m_internal;
  data_06.deleter.m_device = local_5e8.deleter.m_device;
  data_06.deleter.m_allocator = local_5e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)6>_> *)
             &fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator,
             data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move(&local_608);
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_3b8);
  local_610 = pHVar24->m_internal;
  VVar16 = (*vk_00->_vptr_DeviceInterface[2])
                     (vk_00,0,1,
                      &fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                       m_allocator,local_610);
  ::vk::checkResult(VVar16,
                    "vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe8);
  uVar4 = queues[0]._8_8_;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                       &fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_allocator);
  local_618 = pHVar24->m_internal;
  VVar16 = (*vk_00->_vptr_DeviceInterface[2])
                     (vk_00,uVar4,1,&submitInfo[0].pSignalSemaphores,local_618);
  ::vk::checkResult(VVar16,
                    "vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                    ,0xe9);
  ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                       ((RefBase<vk::VkDevice_s_*> *)
                        &queueFamilyProperties.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pVVar2 = *ppVVar21;
  pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_3b8);
  iVar17 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,pVVar2,1,pHVar24,1,0xffffffffffffffff);
  if (iVar17 == 0) {
    ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                         ((RefBase<vk::VkDevice_s_*> *)
                          &queueFamilyProperties.
                           super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pVVar2 = *ppVVar21;
    pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                        ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                         &fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                          m_allocator);
    iVar17 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,pVVar2,1,pHVar24,1,0xffffffffffffffff);
    uVar14 = submitInfo[1]._56_8_;
    ppVVar13 = submitInfo[1].pCommandBuffers;
    uVar11 = submitInfo[1]._40_8_;
    pVVar10 = submitInfo[1].pWaitDstStageMask;
    pVVar9 = submitInfo[1].pWaitSemaphores;
    uVar7 = submitInfo[1]._16_8_;
    pvVar6 = submitInfo[1].pNext;
    uVar4 = submitInfo[1]._0_8_;
    pVVar3 = submitInfo[0].pSignalSemaphores;
    if (iVar17 == 0) {
      swapInfo.signalSemaphoreCount = submitInfo[1].signalSemaphoreCount;
      swapInfo._60_4_ = submitInfo[1]._60_4_;
      swapInfo.commandBufferCount = submitInfo[1].commandBufferCount;
      swapInfo._44_4_ = submitInfo[1]._44_4_;
      swapInfo.pCommandBuffers = submitInfo[1].pCommandBuffers;
      swapInfo.pWaitSemaphores = submitInfo[1].pWaitSemaphores;
      swapInfo.pWaitDstStageMask = submitInfo[1].pWaitDstStageMask;
      swapInfo.pNext = submitInfo[1].pNext;
      swapInfo.waitSemaphoreCount = submitInfo[1].waitSemaphoreCount;
      swapInfo._20_4_ = submitInfo[1]._20_4_;
      pVStack_6b8 = submitInfo[0].pSignalSemaphores;
      swapInfo.sType = submitInfo[1].sType;
      swapInfo._4_4_ = submitInfo[1]._4_4_;
      submitInfo[1].signalSemaphoreCount = submitInfo[0].signalSemaphoreCount;
      submitInfo[1]._60_4_ = submitInfo[0]._60_4_;
      uVar15 = submitInfo[1]._56_8_;
      submitInfo[1].commandBufferCount = submitInfo[0].commandBufferCount;
      submitInfo[1]._44_4_ = submitInfo[0]._44_4_;
      uVar12 = submitInfo[1]._40_8_;
      submitInfo[1].pCommandBuffers = submitInfo[0].pCommandBuffers;
      submitInfo[1].pWaitSemaphores = submitInfo[0].pWaitSemaphores;
      submitInfo[1].pWaitDstStageMask = submitInfo[0].pWaitDstStageMask;
      submitInfo[1].pNext = submitInfo[0].pNext;
      submitInfo[1].waitSemaphoreCount = submitInfo[0].waitSemaphoreCount;
      submitInfo[1]._20_4_ = submitInfo[0]._20_4_;
      uVar8 = submitInfo[1]._16_8_;
      submitInfo[0].pSignalSemaphores =
           (VkSemaphore *)
           fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
      submitInfo[1].sType = submitInfo[0].sType;
      submitInfo[1]._4_4_ = submitInfo[0]._4_4_;
      uVar5 = submitInfo[1]._0_8_;
      submitInfo[1].signalSemaphoreCount = (deUint32)uVar14;
      submitInfo[1]._60_4_ = SUB84(uVar14,4);
      submitInfo[0].signalSemaphoreCount = submitInfo[1].signalSemaphoreCount;
      submitInfo[0]._60_4_ = submitInfo[1]._60_4_;
      submitInfo[1].commandBufferCount = (deUint32)uVar11;
      submitInfo[1]._44_4_ = SUB84(uVar11,4);
      submitInfo[0].commandBufferCount = submitInfo[1].commandBufferCount;
      submitInfo[0]._44_4_ = submitInfo[1]._44_4_;
      submitInfo[0].pCommandBuffers = ppVVar13;
      submitInfo[0].pWaitSemaphores = pVVar9;
      submitInfo[0].pWaitDstStageMask = pVVar10;
      submitInfo[0].pNext = pvVar6;
      submitInfo[1].waitSemaphoreCount = (deUint32)uVar7;
      submitInfo[1]._20_4_ = SUB84(uVar7,4);
      submitInfo[0].waitSemaphoreCount = submitInfo[1].waitSemaphoreCount;
      submitInfo[0]._20_4_ = submitInfo[1]._20_4_;
      fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)pVVar3;
      submitInfo[1].sType = (VkStructureType)uVar4;
      submitInfo[1]._4_4_ = SUB84(uVar4,4);
      submitInfo[0].sType = submitInfo[1].sType;
      submitInfo[0]._4_4_ = submitInfo[1]._4_4_;
      submitInfo[1]._0_8_ = uVar5;
      submitInfo[1]._16_8_ = uVar8;
      submitInfo[1]._40_8_ = uVar12;
      submitInfo[1]._56_8_ = uVar15;
      submitInfo[1]._40_8_ =
           ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                     ((RefBase<vk::VkCommandBuffer_s_*> *)
                      &cmdBuffer[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
      submitInfo[0]._40_8_ =
           ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                     ((RefBase<vk::VkCommandBuffer_s_*> *)(local_2dc + 4));
      ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                           ((RefBase<vk::VkDevice_s_*> *)
                            &queueFamilyProperties.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pVVar2 = *ppVVar21;
      pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                          ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_3b8);
      VVar16 = (*vk_00->_vptr_DeviceInterface[0x14])(vk_00,pVVar2,1,pHVar24);
      ::vk::checkResult(VVar16,"vk.resetFences(*logicalDevice, 1u, &fence[FIRST].get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xf9);
      ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                           ((RefBase<vk::VkDevice_s_*> *)
                            &queueFamilyProperties.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pVVar2 = *ppVVar21;
      pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                          ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                           &fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                            m_allocator);
      VVar16 = (*vk_00->_vptr_DeviceInterface[0x14])(vk_00,pVVar2,1,pHVar24);
      ::vk::checkResult(VVar16,"vk.resetFences(*logicalDevice, 1u, &fence[SECOND].get())",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xfa);
      uVar4 = queues[0]._8_8_;
      pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                           &fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                            m_allocator);
      local_6c0 = pHVar24->m_internal;
      VVar16 = (*vk_00->_vptr_DeviceInterface[2])
                         (vk_00,uVar4,1,&submitInfo[0].pSignalSemaphores,local_6c0);
      ::vk::checkResult(VVar16,
                        "vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xfc);
      pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::operator*
                          ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_3b8);
      local_6c8 = pHVar24->m_internal;
      VVar16 = (*vk_00->_vptr_DeviceInterface[2])
                         (vk_00,0,1,
                          &fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                           m_allocator,local_6c8);
      ::vk::checkResult(VVar16,
                        "vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST])"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationBasicSemaphoreTests.cpp"
                        ,0xfd);
      ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                           ((RefBase<vk::VkDevice_s_*> *)
                            &queueFamilyProperties.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pVVar2 = *ppVVar21;
      pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                          ((RefBase<vk::Handle<(vk::HandleType)6>_> *)local_3b8);
      iVar17 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,pVVar2,1,pHVar24,1,0xffffffffffffffff);
      if (iVar17 == 0) {
        ppVVar21 = ::vk::refdetails::RefBase<vk::VkDevice_s_*>::operator*
                             ((RefBase<vk::VkDevice_s_*> *)
                              &queueFamilyProperties.
                               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pVVar2 = *ppVVar21;
        pHVar24 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::get
                            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)
                             &fence[0].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                              m_allocator);
        iVar17 = (*vk_00->_vptr_DeviceInterface[0x16])(vk_00,pVVar2,1,pHVar24,1,0xffffffffffffffff);
        if (iVar17 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_738,"Basic semaphore tests with multi queue passed",&local_739
                    );
          tcu::TestStatus::pass(__return_storage_ptr__,&local_738);
          std::__cxx11::string::~string((string *)&local_738);
          std::allocator<char>::~allocator(&local_739);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_710,"Basic semaphore tests with multi queue failed",&local_711
                    );
          tcu::TestStatus::fail(__return_storage_ptr__,&local_710);
          std::__cxx11::string::~string((string *)&local_710);
          std::allocator<char>::~allocator(&local_711);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_6e8,"Basic semaphore tests with multi queue failed",&local_6e9);
        tcu::TestStatus::fail(__return_storage_ptr__,&local_6e8);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::allocator<char>::~allocator(&local_6e9);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_660,"Basic semaphore tests with multi queue failed",&local_661);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_660);
      std::__cxx11::string::~string((string *)&local_660);
      std::allocator<char>::~allocator(&local_661);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_638,"Basic semaphore tests with multi queue failed",&local_639);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_638);
    std::__cxx11::string::~string((string *)&local_638);
    std::allocator<char>::~allocator(&local_639);
  }
  local_640 = 1;
  local_9b8 = &fence[1].super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
  do {
    local_9b8 = local_9b8 + -4;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)6>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)6>_> *)local_9b8);
  } while (local_9b8 != (VkAllocationCallbacks **)local_3b8);
  local_9d0 = &cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool;
  do {
    local_9d0 = local_9d0 + -4;
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move
              ((Move<vk::VkCommandBuffer_s_*> *)local_9d0);
  } while (local_9d0 != (VkCommandPool *)(local_2dc + 4));
  local_a00 = &cmdPool[1].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  do {
    local_a00 = local_a00 + -4;
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)local_a00);
  } while ((VkCommandPool *)local_a00 !=
           &cmdBuffer[1].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)4>_> *)local_248);
  std::vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::~vector
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &deviceInfo.pEnabledFeatures);
  ::vk::refdetails::Move<vk::VkDevice_s_*>::~Move
            ((Move<vk::VkDevice_s_*> *)
             &queueFamilyProperties.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus basicMultiQueueCase (Context& context)
{
	enum {NO_MATCH_FOUND = ~((deUint32)0)};
	enum QueuesIndexes {FIRST = 0, SECOND, COUNT};

	struct Queues
	{
		VkQueue		queue;
		deUint32	queueFamilyIndex;
	};


	const DeviceInterface&					vk							= context.getDeviceInterface();
	const InstanceInterface&				instance					= context.getInstanceInterface();
	const VkPhysicalDevice					physicalDevice				= context.getPhysicalDevice();
	vk::Move<vk::VkDevice>					logicalDevice;
	std::vector<VkQueueFamilyProperties>	queueFamilyProperties;
	VkDeviceCreateInfo						deviceInfo;
	VkPhysicalDeviceFeatures				deviceFeatures;
	const float								queuePriorities[COUNT]		= {1.0f, 1.0f};
	VkDeviceQueueCreateInfo					queueInfos[COUNT];
	Queues									queues[COUNT]				=
																		{
																			{DE_NULL, (deUint32)NO_MATCH_FOUND},
																			{DE_NULL, (deUint32)NO_MATCH_FOUND}
																		};
	const VkCommandBufferBeginInfo			info						=
																		{
																			VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType                          sType;
																			DE_NULL,										// const void*                              pNext;
																			VK_COMMAND_BUFFER_USAGE_SIMULTANEOUS_USE_BIT,	// VkCommandBufferUsageFlags                flags;
																			DE_NULL,										// const VkCommandBufferInheritanceInfo*    pInheritanceInfo;
																		};
	Move<VkSemaphore>						semaphore;
	Move<VkCommandPool>						cmdPool[COUNT];
	Move<VkCommandBuffer>					cmdBuffer[COUNT];
	const VkPipelineStageFlags				stageBits[]					= { VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT };
	VkSubmitInfo							submitInfo[COUNT];
	Move<VkFence>							fence[COUNT];

	queueFamilyProperties = getPhysicalDeviceQueueFamilyProperties(instance, physicalDevice);

	for (deUint32 queueNdx = 0; queueNdx < queueFamilyProperties.size(); ++queueNdx)
	{
		if (NO_MATCH_FOUND == queues[FIRST].queueFamilyIndex)
			queues[FIRST].queueFamilyIndex = queueNdx;

		if (queues[FIRST].queueFamilyIndex != queueNdx || queueFamilyProperties[queueNdx].queueCount > 1u)
		{
			queues[SECOND].queueFamilyIndex = queueNdx;
			break;
		}
	}

	if (queues[FIRST].queueFamilyIndex == NO_MATCH_FOUND || queues[SECOND].queueFamilyIndex == NO_MATCH_FOUND)
		TCU_THROW(NotSupportedError, "Queues couldn't be created");

	for (int queueNdx = 0; queueNdx < COUNT; ++queueNdx)
	{
		VkDeviceQueueCreateInfo queueInfo;
		deMemset(&queueInfo, 0, sizeof(queueInfo));

		queueInfo.sType				= VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
		queueInfo.pNext				= DE_NULL;
		queueInfo.flags				= (VkDeviceQueueCreateFlags)0u;
		queueInfo.queueFamilyIndex	= queues[queueNdx].queueFamilyIndex;
		queueInfo.queueCount		= (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex) ? 2 : 1;
		queueInfo.pQueuePriorities	= queuePriorities;

		queueInfos[queueNdx]		= queueInfo;

		if (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex)
			break;
	}

	deMemset(&deviceInfo, 0, sizeof(deviceInfo));
	instance.getPhysicalDeviceFeatures(physicalDevice, &deviceFeatures);

	deviceInfo.sType					= VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	deviceInfo.pNext					= DE_NULL;
	deviceInfo.enabledExtensionCount	= 0u;
	deviceInfo.ppEnabledExtensionNames	= DE_NULL;
	deviceInfo.enabledLayerCount		= 0u;
	deviceInfo.ppEnabledLayerNames		= DE_NULL;
	deviceInfo.pEnabledFeatures			= &deviceFeatures;
	deviceInfo.queueCreateInfoCount		= (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex) ? 1 : COUNT;
	deviceInfo.pQueueCreateInfos		= queueInfos;

	logicalDevice = vk::createDevice(instance, physicalDevice, &deviceInfo);

	for (deUint32 queueReqNdx = 0; queueReqNdx < COUNT; ++queueReqNdx)
	{
		if (queues[FIRST].queueFamilyIndex == queues[SECOND].queueFamilyIndex)
			vk.getDeviceQueue(*logicalDevice, queues[queueReqNdx].queueFamilyIndex, queueReqNdx, &queues[queueReqNdx].queue);
		else
			vk.getDeviceQueue(*logicalDevice, queues[queueReqNdx].queueFamilyIndex, 0u, &queues[queueReqNdx].queue);
	}

	semaphore			= (createSemaphore (vk, *logicalDevice));
	cmdPool[FIRST]		= (createCommandPool(vk, *logicalDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queues[FIRST].queueFamilyIndex));
	cmdPool[SECOND]		= (createCommandPool(vk, *logicalDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queues[SECOND].queueFamilyIndex));
	cmdBuffer[FIRST]	= (makeCommandBuffer(vk, *logicalDevice, *cmdPool[FIRST]));
	cmdBuffer[SECOND]	= (makeCommandBuffer(vk, *logicalDevice, *cmdPool[SECOND]));

	submitInfo[FIRST].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
	submitInfo[FIRST].pNext					= DE_NULL;
	submitInfo[FIRST].waitSemaphoreCount	= 0u;
	submitInfo[FIRST].pWaitSemaphores		= DE_NULL;
	submitInfo[FIRST].pWaitDstStageMask		= (const VkPipelineStageFlags*)DE_NULL;
	submitInfo[FIRST].commandBufferCount	= 1u;
	submitInfo[FIRST].pCommandBuffers		= &cmdBuffer[FIRST].get();
	submitInfo[FIRST].signalSemaphoreCount	= 1u;
	submitInfo[FIRST].pSignalSemaphores		= &semaphore.get();

	submitInfo[SECOND].sType					= VK_STRUCTURE_TYPE_SUBMIT_INFO;
	submitInfo[SECOND].pNext					= DE_NULL;
	submitInfo[SECOND].waitSemaphoreCount		= 1u;
	submitInfo[SECOND].pWaitSemaphores			= &semaphore.get();
	submitInfo[SECOND].pWaitDstStageMask		= stageBits;
	submitInfo[SECOND].commandBufferCount		= 1u;
	submitInfo[SECOND].pCommandBuffers			= &cmdBuffer[SECOND].get();
	submitInfo[SECOND].signalSemaphoreCount		= 0u;
	submitInfo[SECOND].pSignalSemaphores		= DE_NULL;

	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer[FIRST], &info));
	endCommandBuffer(vk, *cmdBuffer[FIRST]);
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer[SECOND], &info));
	endCommandBuffer(vk, *cmdBuffer[SECOND]);

	fence[FIRST]  = (createFence(vk, *logicalDevice));
	fence[SECOND] = (createFence(vk, *logicalDevice));

	VK_CHECK(vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST]));
	VK_CHECK(vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND]));

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[FIRST].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[SECOND].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	{
		VkSubmitInfo swapInfo				= submitInfo[SECOND];
		submitInfo[SECOND]					= submitInfo[FIRST];
		submitInfo[FIRST]					= swapInfo;
		submitInfo[SECOND].pCommandBuffers	= &cmdBuffer[SECOND].get();
		submitInfo[FIRST].pCommandBuffers	= &cmdBuffer[FIRST].get();
	}

	VK_CHECK(vk.resetFences(*logicalDevice, 1u, &fence[FIRST].get()));
	VK_CHECK(vk.resetFences(*logicalDevice, 1u, &fence[SECOND].get()));

	VK_CHECK(vk.queueSubmit(queues[SECOND].queue, 1u, &submitInfo[SECOND], *fence[SECOND]));
	VK_CHECK(vk.queueSubmit(queues[FIRST].queue, 1u, &submitInfo[FIRST], *fence[FIRST]));

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[FIRST].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	if (VK_SUCCESS != vk.waitForFences(*logicalDevice, 1u, &fence[SECOND].get(), DE_TRUE, FENCE_WAIT))
		return tcu::TestStatus::fail("Basic semaphore tests with multi queue failed");

	return tcu::TestStatus::pass("Basic semaphore tests with multi queue passed");
}